

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this,int key,char *buffer,int length)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  long lVar3;
  Socket *sock;
  allocator local_81;
  string local_80 [32];
  string local_60 [8];
  string tag;
  int size;
  AGSSocketSerial serial;
  int length_local;
  char *buffer_local;
  int key_local;
  AGSSocket *this_local;
  
  tag.field_2._8_4_ = length;
  if (0x17 < (uint)length) {
    tag.field_2._8_4_ = 0x18;
  }
  memcpy((void *)((long)&tag.field_2 + 0xc),buffer,(long)(int)tag.field_2._8_4_);
  std::__cxx11::string::string(local_60);
  if (0 < length - tag.field_2._8_4_) {
    lVar3 = (long)(int)tag.field_2._8_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,buffer + lVar3,length - lVar3,&local_81);
    std::__cxx11::string::operator=(local_60,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  puVar1 = (undefined4 *)operator_new(0xa0);
  *puVar1 = 0xffffffff;
  puVar1[1] = tag.field_2._12_4_;
  puVar1[2] = size;
  puVar1[3] = serial.domain;
  puVar1[4] = serial.type;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,serial.protocol);
  *(undefined8 *)(puVar1 + 6) = uVar2;
  uVar2 = (**(code **)(*AGSSockAPI::engine + 0x238))(AGSSockAPI::engine,serial.error);
  *(undefined8 *)(puVar1 + 8) = uVar2;
  std::__cxx11::string::string((string *)(puVar1 + 10),local_60);
  Buffer::Buffer((Buffer *)(puVar1 + 0x12));
  (**(code **)(*AGSSockAPI::engine + 0x230))(AGSSockAPI::engine,key,puVar1,&agsSocket);
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}